

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O1

void __thiscall inja::Renderer::visit(Renderer *this,IncludeStatementNode *node)

{
  const_iterator cVar1;
  long *plVar2;
  size_type *psVar3;
  Renderer sub_renderer;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  Renderer local_168;
  
  Renderer(&local_168,&this->config,this->template_storage,this->function_storage);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
          ::find(&this->template_storage->_M_t,&node->file);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->template_storage->_M_t)._M_impl.super__Rb_tree_header) {
    if ((this->config).throw_at_missing_includes == true) {
      ::std::operator+(&local_188,"include \'",&node->file);
      plVar2 = (long *)::std::__cxx11::string::append((char *)&local_188);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_1a8.field_2._M_allocated_capacity = *psVar3;
        local_1a8.field_2._8_8_ = plVar2[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar3;
        local_1a8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_1a8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      throw_renderer_error(this,&local_1a8,(AstNode *)node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    render_to(&local_168,this->output_stream,(Template *)(cVar1._M_node + 2),this->data_input,
              &this->additional_data);
  }
  local_168.super_NodeVisitor._vptr_NodeVisitor = (_func_int **)&PTR__Renderer_001b1210;
  std::_Deque_base<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>::~_Deque_base
            ((_Deque_base<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_> *)
             &local_168.not_found_stack);
  std::
  _Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
  ::~_Deque_base((_Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  *)&local_168.data_eval_stack);
  std::
  vector<std::shared_ptr<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::shared_ptr<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
  ::~vector(&local_168.data_tmp_stack);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::assert_invariant(&local_168.additional_data,false);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_168.additional_data.m_data);
  if (local_168.block_statement_stack.
      super__Vector_base<const_inja::BlockStatementNode_*,_std::allocator<const_inja::BlockStatementNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.block_statement_stack.
                    super__Vector_base<const_inja::BlockStatementNode_*,_std::allocator<const_inja::BlockStatementNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.block_statement_stack.
                          super__Vector_base<const_inja::BlockStatementNode_*,_std::allocator<const_inja::BlockStatementNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.block_statement_stack.
                          super__Vector_base<const_inja::BlockStatementNode_*,_std::allocator<const_inja::BlockStatementNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.template_stack.
      super__Vector_base<const_inja::Template_*,_std::allocator<const_inja::Template_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.template_stack.
                    super__Vector_base<const_inja::Template_*,_std::allocator<const_inja::Template_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.template_stack.
                          super__Vector_base<const_inja::Template_*,_std::allocator<const_inja::Template_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.template_stack.
                          super__Vector_base<const_inja::Template_*,_std::allocator<const_inja::Template_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void visit(const IncludeStatementNode& node) {
    auto sub_renderer = Renderer(config, template_storage, function_storage);
    const auto included_template_it = template_storage.find(node.file);
    if (included_template_it != template_storage.end()) {
      sub_renderer.render_to(*output_stream, included_template_it->second, *data_input, &additional_data);
    } else if (config.throw_at_missing_includes) {
      throw_renderer_error("include '" + node.file + "' not found", node);
    }
  }